

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Iterating_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Iterating_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  char *message;
  long lVar2;
  char *file;
  long lVar3;
  AssertHelper *this_00;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  long in_RDI;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  int i;
  iterator it;
  undefined4 in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffccc;
  uint7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  int line;
  Type type;
  string local_2d8 [8];
  char *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd38;
  char *in_stack_fffffffffffffd40;
  AssertionResult *in_stack_fffffffffffffd48;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffd50;
  iterator local_2a8;
  undefined1 local_281;
  AssertionResult local_280;
  string local_270 [64];
  iterator local_230;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_210;
  undefined1 local_1f1;
  AssertionResult local_1f0;
  int local_1dc;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_1d8 [3];
  value_type local_190;
  value_type local_160;
  value_type local_130;
  value_type local_100;
  value_type local_d0;
  value_type local_a0;
  value_type local_70;
  value_type local_40;
  value_type local_10;
  
  local_10 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
  message = (char *)(in_RDI + 0x10);
  local_40 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
  lVar2 = in_RDI + 0x10;
  local_70 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
  file = (char *)(in_RDI + 0x10);
  local_a0 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
  lVar3 = in_RDI + 0x10;
  local_d0 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
  this_00 = (AssertHelper *)(in_RDI + 0x10);
  local_100 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
  local_130 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
  this_01 = (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)(in_RDI + 0x10);
  local_160 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
  local_190 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(this_01);
  local_1dc = 1;
  while( true ) {
    type = (Type)((ulong)lVar3 >> 0x20);
    line = (int)((ulong)lVar2 >> 0x20);
    if (9 < local_1dc) break;
    in_stack_fffffffffffffcd7 = false;
    if (local_1dc != 0) {
      google::
      dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::operator++((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)(ulong)in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
      google::
      BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::end(this_01);
      in_stack_fffffffffffffcd7 =
           google::
           dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::operator!=(&local_210,&local_230);
    }
    local_1f1 = in_stack_fffffffffffffcd7;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
               (bool *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
               (type *)0xaf93e7);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f0);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 in_stack_fffffffffffffd30);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,(Type)((ulong)lVar3 >> 0x20),file,(int)((ulong)lVar2 >> 0x20),message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffd50,(Message *)in_stack_fffffffffffffd48);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
      std::__cxx11::string::~string(local_270);
      testing::Message::~Message((Message *)0xaf94a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xaf953c);
    local_1dc = local_1dc + 1;
  }
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(this_01);
  local_281 = google::
              dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==(local_1d8,&local_2a8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
             (bool *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),(type *)0xaf95b1)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_280);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               in_stack_fffffffffffffd30);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_00,type,file,line,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd50,(Message *)in_stack_fffffffffffffd48);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
    std::__cxx11::string::~string(local_2d8);
    testing::Message::~Message((Message *)0xaf9669);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xaf96f4);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Iterating) {
  // Test a bit more iterating than just one ++.
  this->ht_.insert(this->UniqueObject(1));
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  typename TypeParam::iterator it = this->ht_.begin();
  for (int i = 1; i <= 9; i++) {  // start at 1 so i is never 0
    // && here makes it easier to tell what loop iteration the test failed on.
    EXPECT_TRUE(i && (it++ != this->ht_.end()));
  }
  EXPECT_TRUE(it == this->ht_.end());
}